

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O3

void nn_fsm_event_process(nn_fsm_event *self)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  nn_fsm *pnVar4;
  
  iVar1 = self->src;
  iVar2 = self->type;
  pvVar3 = self->srcptr;
  self->src = -1;
  self->type = -1;
  self->srcptr = (void *)0x0;
  pnVar4 = self->fsm;
  (*(&pnVar4->fn)[pnVar4->state == 3])(pnVar4,iVar1,iVar2,pvVar3);
  return;
}

Assistant:

void nn_fsm_event_process (struct nn_fsm_event *self)
{
    int src;
    int type;
    void *srcptr;

    src = self->src;
    type = self->type;
    srcptr = self->srcptr;
    self->src = -1;
    self->type = -1;
    self->srcptr = NULL;

    nn_fsm_feed (self->fsm, src, type, srcptr);
}